

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O0

void __thiscall
Potassco::SmodelsOutput::rule
          (SmodelsOutput *this,Head_t ht,AtomSpan *head,Weight_t bound,WeightLitSpan *body)

{
  bool bVar1;
  int iVar2;
  undefined4 in_ECX;
  SmodelsOutput *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_R8;
  SmodelsRule rt;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffbc;
  undefined1 card;
  undefined1 in_stack_ffffffffffffffc0 [16];
  Head_t in_stack_ffffffffffffffd0;
  Head_t in_stack_ffffffffffffffd4;
  Weight_t bound_00;
  undefined4 in_stack_ffffffffffffffe0;
  long lVar3;
  Head_t ht_00;
  
  bound_00 = (Weight_t)((ulong)in_R8 >> 0x20);
  if (*(int *)(in_RDI + 0x14) != 0) {
    fail(-2,
         "virtual void Potassco::SmodelsOutput::rule(Head_t, const AtomSpan &, Weight_t, const WeightLitSpan &)"
         ,0x145,"sec_ == 0","adding rules after symbols not supported",0);
  }
  lVar3 = in_RDI;
  bVar1 = empty<unsigned_int>((Span<unsigned_int> *)in_RDX);
  ht_00.val_ = (E)((ulong)lVar3 >> 0x20);
  if (bVar1) {
    if (*(int *)(in_RDI + 0x10) == 0) {
      fail(-2,
           "virtual void Potassco::SmodelsOutput::rule(Head_t, const AtomSpan &, Weight_t, const WeightLitSpan &)"
           ,0x147,"false_ != 0","empty head requires false atom",0);
    }
    *(undefined1 *)(in_RDI + 0x1a) = 1;
    toSpan<unsigned_int>((uint *)(in_RDI + 0x10),1);
    rule(in_RDX,ht_00,(AtomSpan *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),bound_00,
         (WeightLitSpan *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0.val_));
  }
  else {
    iVar2 = isSmodelsRule(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0._8_8_,
                          in_stack_ffffffffffffffc0._4_4_,
                          (WeightLitSpan *)CONCAT44(in_stack_ffffffffffffffbc,in_ESI));
    if (iVar2 == 0) {
      fail(-2,
           "virtual void Potassco::SmodelsOutput::rule(Head_t, const AtomSpan &, Weight_t, const WeightLitSpan &)"
           ,0x14c,"rt != End","unsupported rule type",0);
    }
    startRule((SmodelsOutput *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
              (int)((ulong)in_RDI >> 0x20));
    card = (undefined1)((uint)iVar2 >> 0x18);
    add(in_stack_ffffffffffffffc0._8_8_,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc0._0_8_);
    add((SmodelsOutput *)CONCAT44(in_stack_ffffffffffffffd4.val_,in_stack_ffffffffffffffd0.val_),
        in_stack_ffffffffffffffc0._12_4_,in_stack_ffffffffffffffc0._0_8_,(bool)card);
    endRule((SmodelsOutput *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0));
  }
  return;
}

Assistant:

void SmodelsOutput::rule(Head_t ht, const AtomSpan& head, Weight_t bound, const WeightLitSpan& body) {
	POTASSCO_REQUIRE(sec_ == 0, "adding rules after symbols not supported");
	if (empty(head)) {
		POTASSCO_REQUIRE(false_ != 0, "empty head requires false atom");
		fHead_ = true;
		return SmodelsOutput::rule(ht, toSpan(&false_, 1), bound, body);
	}
	SmodelsRule rt = (SmodelsRule)isSmodelsRule(ht, head, bound, body);
	POTASSCO_REQUIRE(rt != End, "unsupported rule type");
	startRule(rt).add(ht, head).add(bound, body, rt == Cardinality).endRule();
}